

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O1

void CorUnix::CPalSynchronizationManager::AcquireLocalSynchLock(CPalThread *pthrCurrent)

{
  if ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val < 0) {
    fprintf(_stderr,"] %s %s:%d","AcquireLocalSynchLock",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.hpp"
            ,0x26e);
    fprintf(_stderr,"Expression: 0 <= pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount\n");
  }
  (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val =
       (pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val + 1;
  if ((pthrCurrent->synchronizationInfo).m_lLocalSynchLockCount.m_val == 1) {
    InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csSynchProcessLock);
    return;
  }
  return;
}

Assistant:

static void AcquireLocalSynchLock(CPalThread * pthrCurrent)
        { 
            _ASSERTE(0 <= pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount);
            
            if (1 == ++pthrCurrent->synchronizationInfo.m_lLocalSynchLockCount)
            {
                InternalEnterCriticalSection(pthrCurrent, &s_csSynchProcessLock);
            }
        }